

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv__process_init(uv_loop_t *loop)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = uv_signal_init(loop,&loop->child_watcher);
  if (iVar3 == 0) {
    uVar2 = (loop->child_watcher).flags;
    if (((uVar2 & 8) != 0) && ((loop->child_watcher).flags = uVar2 & 0xfffffff7, (uVar2 & 5) == 4))
    {
      puVar1 = &((loop->child_watcher).loop)->active_handles;
      *puVar1 = *puVar1 - 1;
    }
    puVar1 = &(loop->child_watcher).flags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int uv__process_init(uv_loop_t* loop) {
  int err;

  err = uv_signal_init(loop, &loop->child_watcher);
  if (err)
    return err;
  uv__handle_unref(&loop->child_watcher);
  loop->child_watcher.flags |= UV_HANDLE_INTERNAL;
  return 0;
}